

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsscenebsptreeindex_p.cpp
# Opt level: O2

void QGraphicsSceneBspTreeIndex::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == WriteProperty) {
    if (_id == 0) {
      setBspTreeDepth((QGraphicsSceneBspTreeIndex *)_o,**_a);
      return;
    }
  }
  else if (_c == ReadProperty) {
    if (_id == 0) {
      *(undefined4 *)*_a = *(undefined4 *)(*(long *)(_o + 8) + 0xf8);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex
                (*(QGraphicsSceneBspTreeIndexPrivate **)(_o + 8));
      return;
    }
    if (_id == 1) {
      QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache
                (*(QGraphicsSceneBspTreeIndexPrivate **)(_o + 8));
      return;
    }
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0xa0))(_o,_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsSceneBspTreeIndex *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateSceneRect((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->d_func()->_q_updateSortCache(); break;
        case 2: _t->d_func()->_q_updateIndex(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->bspTreeDepth(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBspTreeDepth(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}